

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_config.cc
# Opt level: O2

bool __thiscall flyd::Config::Load(Config *this,char *pconfName)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  __hashtable *__h;
  string item_content;
  string item_name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_268;
  char linebuf [501];
  
  __stream = fopen(pconfName,"r");
  if (__stream != (FILE *)0x0) {
    while( true ) {
      iVar1 = feof(__stream);
      if (iVar1 != 0) break;
      pcVar2 = fgets(linebuf,500,__stream);
      if ((linebuf[0] != '\0' && pcVar2 != (char *)0x0) &&
         (((0x3b < (byte)linebuf[0] - 0x20 ||
           ((0x800000008000009U >> ((ulong)((byte)linebuf[0] - 0x20) & 0x3f) & 1) == 0)) &&
          (1 < (byte)linebuf[0] - 9)))) {
        pcVar2 = strchr(linebuf,0x3d);
        if (pcVar2 != (char *)0x0) {
          item_name._M_dataplus._M_p = (pointer)&item_name.field_2;
          item_name._M_string_length = 0;
          item_name.field_2._M_local_buf[0] = '\0';
          item_content._M_dataplus._M_p = (pointer)&item_content.field_2;
          item_content._M_string_length = 0;
          item_content.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::append((char *)&item_name,(ulong)linebuf);
          std::__cxx11::string::append((char *)&item_content);
          Trim(&item_name);
          std::__cxx11::string::_M_assign((string *)&item_name);
          Trim(&item_content);
          std::__cxx11::string::_M_assign((string *)&item_content);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (&local_268,&item_name,&item_content);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)this,&local_268);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(&local_268);
          std::__cxx11::string::~string((string *)&item_content);
          std::__cxx11::string::~string((string *)&item_name);
        }
      }
    }
    fclose(__stream);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool Config::Load(const char *pconfName)
{
    FILE *fp;
    fp = fopen(pconfName, "r");
    if(fp == NULL) {
        return false;
    }
    //每一行配置文件读出来都放在这里
    char linebuf[501];//每行配置都不要太长，保持<500字符
    //文件成功打开
    while(!feof(fp)) //检查文件是否结束
    {
        if(fgets(linebuf, 500, fp) == NULL)//从文件中读出一行,若空则重新读
            continue;

        if(linebuf[0] == 0)
            continue;

        //处理注释行
        if(*linebuf == ';' || *linebuf == ' '
        || *linebuf == '#' || *linebuf == '\t' || *linebuf == '\n')
            continue;

        if(linebuf[0] == 0)
            continue;
        if(*linebuf == '[')
            continue;

        //开始处理实际有效的配置文件
        char *ptmp = strchr(linebuf, '=');//获得“=”的地址
        if(ptmp != NULL)
        {
            std::string item_name, item_content;

            item_name.append(linebuf, (int)(ptmp - linebuf));
            item_content.append(ptmp + 1);
            item_name = Trim(item_name);
            item_content = Trim(item_content);

            config_map_.insert({item_name, item_content});
        }
    }  //end while(!feof(fp))
    ::fclose(fp);
    return true;
}